

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa.c
# Opt level: O2

void * soa_alloc(soa_t *allocator,size_t size)

{
  uint __line;
  void *pvVar1;
  soa_fsa_t *allocator_00;
  char *__assertion;
  
  if (0x1f < size - 1) {
    __assertion = "(size<=SOA_SMALL_OBJECT_MAX_SIZE) && (size>0)";
    __line = 0x46;
LAB_0010325d:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa.c"
                  ,__line,"void *soa_alloc(soa_t *, size_t)");
  }
  allocator_00 = allocator->fsa[size - 1];
  if (allocator_00 == (soa_fsa_t *)0x0) {
    soa_initFSA(allocator,size,0xff);
    allocator_00 = allocator->fsa[size - 1];
    if (allocator_00 == (soa_fsa_t *)0x0) {
      __assertion = "allocator->fsa[size-1]";
      __line = 0x4e;
      goto LAB_0010325d;
    }
  }
  pvVar1 = soa_fsa_alloc(allocator_00);
  return pvVar1;
}

Assistant:

void * soa_alloc( soa_t *allocator, size_t size )
{
  assert((size<=SOA_SMALL_OBJECT_MAX_SIZE) && (size>0)) ;
#if(AUTO_INITIALIZE_FSA)
  if(allocator->fsa[size-1] == 0)
  {
    soa_initFSA(allocator,size,DEFAULT_NUM_BLOCKS);
  }
#endif
  
  assert(allocator->fsa[size-1]);
  return soa_fsa_alloc(allocator->fsa[size-1]);
}